

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall
capnp::EzRpcServer::Impl::acceptLoop
          (Impl *this,Own<kj::ConnectionReceiver> *listener,ReaderOptions readerOpts)

{
  undefined8 uVar1;
  PromiseNode *pPVar2;
  ConnectionReceiver *pCVar3;
  undefined1 local_80 [16];
  Promise<void> local_70;
  Impl *local_60;
  uint64_t local_58;
  int local_50;
  Disposer *local_48;
  ConnectionReceiver *local_40;
  Own<kj::_::PromiseNode> local_38;
  
  (**listener->ptr->_vptr_ConnectionReceiver)
            ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
              *)local_80);
  local_48 = listener->disposer;
  local_40 = listener->ptr;
  listener->ptr = (ConnectionReceiver *)0x0;
  local_60 = this;
  local_58 = readerOpts.traversalLimitInWords;
  local_50 = readerOpts.nestingLimit;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::AsyncIoStream>,kj::CaptureByMove<capnp::EzRpcServer::Impl::acceptLoop(kj::Own<kj::ConnectionReceiver>&&,capnp::ReaderOptions)::_lambda(kj::Own<kj::ConnectionReceiver>&&,kj::Own<kj::AsyncIoStream>&&)_1_,kj::Own<kj::ConnectionReceiver>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::EzRpcServer::Impl::acceptLoop(kj::Own<kj::ConnectionReceiver>&&,capnp::ReaderOptions)::_lambda(kj::Own<kj::ConnectionReceiver>&&,kj::Own<kj::AsyncIoStream>&&)_1_,kj::Own<kj::ConnectionReceiver>>,kj::_::PropagateException>
            (&local_38,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:294:9),_kj::Own<kj::ConnectionReceiver>_>
              *)local_80,(PropagateException *)&local_60);
  local_70.super_PromiseBase.node.disposer = local_38.disposer;
  local_70.super_PromiseBase.node.ptr = local_38.ptr;
  kj::TaskSet::add(&this->tasks,&local_70);
  pPVar2 = local_70.super_PromiseBase.node.ptr;
  if ((Disposer *)local_70.super_PromiseBase.node.ptr != (Disposer *)0x0) {
    local_70.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_70.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_70.super_PromiseBase.node.disposer,
               pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  pCVar3 = local_40;
  if (local_40 != (ConnectionReceiver *)0x0) {
    local_40 = (ConnectionReceiver *)0x0;
    (**local_48->_vptr_Disposer)
              (local_48,pCVar3->_vptr_ConnectionReceiver[-2] +
                        (long)&pCVar3->_vptr_ConnectionReceiver);
  }
  uVar1 = local_80._8_8_;
  if ((long *)local_80._8_8_ != (long *)0x0) {
    local_80._8_8_ = 0;
    (**(((SturdyRefRestorer<capnp::AnyPointer> *)local_80._0_8_)->super_SturdyRefRestorerBase).
       _vptr_SturdyRefRestorerBase)(local_80._0_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  return;
}

Assistant:

void acceptLoop(kj::Own<kj::ConnectionReceiver>&& listener, ReaderOptions readerOpts) {
    auto ptr = listener.get();
    tasks.add(ptr->accept().then(kj::mvCapture(kj::mv(listener),
        [this, readerOpts](kj::Own<kj::ConnectionReceiver>&& listener,
                           kj::Own<kj::AsyncIoStream>&& connection) {
      acceptLoop(kj::mv(listener), readerOpts);

      auto server = kj::heap<ServerContext>(kj::mv(connection), *this, readerOpts);

      // Arrange to destroy the server context when all references are gone, or when the
      // EzRpcServer is destroyed (which will destroy the TaskSet).
      tasks.add(server->network.onDisconnect().attach(kj::mv(server)));
    })));
  }